

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O2

int mem_compress_stdin_open(char *filename,int rwmode,int *hdl)

{
  int handle;
  int iVar1;
  char *pcVar2;
  
  if (rwmode == 0) {
    iVar1 = mem_createmem(0x7080,hdl);
    if (iVar1 == 0) {
      iVar1 = mem_uncompress2mem(filename,_stdin,*hdl);
      handle = *hdl;
      if (iVar1 == 0) {
        if (*memTable[handle].memsizeptr <= memTable[handle].fitsfilesize + 0x100U) {
          return 0;
        }
        pcVar2 = (char *)realloc(*memTable[handle].memaddrptr,memTable[handle].fitsfilesize);
        if (pcVar2 == (char *)0x0) {
          ffpmsg("Failed to reduce size of allocated memory (compress_stdin_open)");
          return 0x71;
        }
        iVar1 = *hdl;
        *memTable[iVar1].memaddrptr = pcVar2;
        *memTable[iVar1].memsizeptr = memTable[iVar1].fitsfilesize;
        return 0;
      }
      mem_close_free(handle);
      pcVar2 = "failed to uncompress stdin into memory (compress_stdin_open)";
    }
    else {
      pcVar2 = "failed to create empty memory file (compress_stdin_open)";
    }
    ffpmsg(pcVar2);
  }
  else {
    ffpmsg("cannot open compressed input stream with WRITE access (mem_compress_stdin_open)");
    iVar1 = 0x70;
  }
  return iVar1;
}

Assistant:

int mem_compress_stdin_open(char *filename, int rwmode, int *hdl)
/*
  This routine reads the compressed input stream and creates an empty memory
  buffer, then calls mem_uncompress2mem.
*/
{
    int status;
    char *ptr;

    if (rwmode != READONLY)
    {
        ffpmsg(
  "cannot open compressed input stream with WRITE access (mem_compress_stdin_open)");
        return(READONLY_FILE);
    }
 
    /* create a memory file for the uncompressed file */
    status = mem_createmem(28800, hdl);

    if (status)
    {
        ffpmsg("failed to create empty memory file (compress_stdin_open)");
        return(status);
    }

    /* uncompress file into memory */
    status = mem_uncompress2mem(filename, stdin, *hdl);

    if (status)
    {
        mem_close_free(*hdl);   /* free up the memory */
        ffpmsg("failed to uncompress stdin into memory (compress_stdin_open)");
        return(status);
    }

    /* if we allocated too much memory initially, then free it */
    if (*(memTable[*hdl].memsizeptr) > 
       (( (size_t) memTable[*hdl].fitsfilesize) + 256L) ) 
    {
        ptr = realloc(*(memTable[*hdl].memaddrptr), 
                      ((size_t) memTable[*hdl].fitsfilesize) );
        if (!ptr)
        {
            ffpmsg("Failed to reduce size of allocated memory (compress_stdin_open)");
            return(MEMORY_ALLOCATION);
        }

        *(memTable[*hdl].memaddrptr) = ptr;
        *(memTable[*hdl].memsizeptr) = (size_t) (memTable[*hdl].fitsfilesize);
    }

    return(0);
}